

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O0

void __thiscall
duckdb::AlpCompressionState<double>::AlpCompressionState
          (AlpCompressionState<double> *this,ColumnDataCheckpointData *checkpoint_data,
          AlpAnalyzeState<double> *analyze_state)

{
  CompressionFunction *pCVar1;
  RowGroup *this_00;
  long in_RDX;
  _func_int **in_RSI;
  CompressionState *in_RDI;
  idx_t in_stack_00000088;
  AlpCompressionState<double> *in_stack_00000090;
  vector<duckdb::alp::AlpCombination,_true> *in_stack_ffffffffffffff98;
  AlpCompressionState<double,_false> *in_stack_ffffffffffffffa0;
  BufferHandle *this_01;
  CompressionInfo *pCVar2;
  ColumnDataCheckpointData *in_stack_ffffffffffffffd0;
  
  CompressionState::CompressionState(in_RDI,(CompressionInfo *)(in_RDX + 8));
  in_RDI->_vptr_CompressionState = (_func_int **)&PTR__AlpCompressionState_0350ee58;
  in_RDI[1]._vptr_CompressionState = in_RSI;
  pCVar2 = &in_RDI[1].info;
  pCVar1 = ColumnDataCheckpointData::GetCompressionFunction
                     (in_stack_ffffffffffffffd0,(CompressionType)((ulong)pCVar2 >> 0x38));
  pCVar2->block_manager = (BlockManager *)pCVar1;
  this_01 = (BufferHandle *)(in_RDI + 2);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xa01176);
  BufferHandle::BufferHandle(this_01);
  in_RDI[4]._vptr_CompressionState = (_func_int **)0x0;
  in_RDI[4].info.block_manager = (BlockManager *)0x0;
  in_RDI[5]._vptr_CompressionState = (_func_int **)0x0;
  in_RDI[5].info.block_manager = (BlockManager *)0x0;
  *(undefined4 *)&in_RDI[7]._vptr_CompressionState = 4;
  alp::AlpCompressionState<double,_false>::AlpCompressionState(in_stack_ffffffffffffffa0);
  this_00 = ColumnDataCheckpointData::GetRowGroup((ColumnDataCheckpointData *)0xa011d4);
  CreateEmptySegment(in_stack_00000090,in_stack_00000088);
  vector<duckdb::alp::AlpCombination,_true>::operator=
            ((vector<duckdb::alp::AlpCombination,_true> *)this_00,in_stack_ffffffffffffff98);
  return;
}

Assistant:

AlpCompressionState(ColumnDataCheckpointData &checkpoint_data, AlpAnalyzeState<T> *analyze_state)
	    : CompressionState(analyze_state->info), checkpoint_data(checkpoint_data),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_ALP)) {
		CreateEmptySegment(checkpoint_data.GetRowGroup().start);

		//! Combinations found on the analyze step are needed for compression
		state.best_k_combinations = analyze_state->state.best_k_combinations;
	}